

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall Graph::setBoundaries(Graph *this)

{
  ulong *puVar1;
  int iVar2;
  _Bit_type *p_Var3;
  pointer ppEVar4;
  pointer *pppEVar5;
  ulong uVar6;
  
  iVar2 = this->vertexCount;
  if (0 < (long)iVar2) {
    p_Var3 = (this->isBoundaryList).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    pppEVar5 = (pointer *)
               ((long)&(((this->adjList).
                         super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl + 8);
    uVar6 = 0;
    do {
      ppEVar4 = ((_Vector_impl_data *)(pppEVar5 + -1))->_M_start;
      if (((long)*pppEVar5 - (long)ppEVar4 != 0x10) || ((*ppEVar4)->ttd != ppEVar4[1]->ttd)) {
        puVar1 = p_Var3 + (uVar6 >> 6);
        *puVar1 = *puVar1 | 1L << (uVar6 & 0x3f);
      }
      uVar6 = uVar6 + 1;
      pppEVar5 = pppEVar5 + 3;
    } while ((long)iVar2 != uVar6);
  }
  return;
}

Assistant:

void Graph::setBoundaries() {
  for(int node = 0; node < vertexCount; node++) {
    if(adjList[node].size() != 2 || adjList[node][0]->ttd != adjList[node][1]->ttd ) {
      isBoundaryList[node] = true;
    }
    
  }
  
}